

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O2

void __thiscall zmq::socket_base_t::process_stop(socket_base_t *this)

{
  scoped_lock_t lock;
  
  lock._mutex = &this->_monitor_sync;
  mutex_t::lock(lock._mutex);
  stop_monitor(this,true);
  this->_ctx_terminated = true;
  scoped_lock_t::~scoped_lock_t(&lock);
  return;
}

Assistant:

void zmq::socket_base_t::process_stop ()
{
    //  Here, someone have called zmq_ctx_term while the socket was still alive.
    //  We'll remember the fact so that any blocking call is interrupted and any
    //  further attempt to use the socket will return ETERM. The user is still
    //  responsible for calling zmq_close on the socket though!
    scoped_lock_t lock (_monitor_sync);
    stop_monitor ();

    _ctx_terminated = true;
}